

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O2

void MiniScript::UnitTest::DeleteAllTests(void)

{
  cTests = 0;
  return;
}

Assistant:

void UnitTest::DeleteAllTests()
	{
		UnitTest *next;
		for (UnitTest *test = cTests; test; test = next) {
			next = test->mNext;
			// Jul 06 2001 -- JJS (1) -- commented out:
			//delete test;
		}
		cTests = 0;
	}